

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O1

int asio_service_test::response_hint_test(bool with_meta)

{
  RaftAsioPkg *this;
  long lVar1;
  undefined8 uVar2;
  char cVar3;
  ostream oVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  pointer ppRVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar13;
  int __how;
  int __how_00;
  pointer ppRVar14;
  char cVar15;
  _Manager_type p_Var16;
  string *msg_00;
  undefined7 in_register_00000039;
  _Alloc_hider _Var17;
  size_t ii;
  ostream *poVar18;
  ulong uVar19;
  unsigned_long __val;
  initializer_list<RaftAsioPkg_*> __l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_00;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_01;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_02;
  buffer_serializer bs;
  raft_params params;
  ptr<buffer> msg_2;
  ptr<buffer> msg;
  buffer_serializer bs_2;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  atomic<unsigned_long> write_resp_cb_count;
  atomic<unsigned_long> read_resp_cb_count;
  atomic<unsigned_long> write_req_cb_count;
  atomic<unsigned_long> read_req_cb_count;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  RaftAsioPkg s1;
  RaftAsioPkg s3;
  RaftAsioPkg s2;
  string local_5d0;
  allocator_type local_5a9;
  undefined1 local_5a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_598;
  _Invoker_type p_Stack_588;
  undefined2 local_580;
  int32 local_57c;
  shared_ptr<nuraft::buffer> local_540;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_530;
  uint local_514;
  undefined1 local_510 [32];
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> local_4f0;
  undefined8 local_4d8;
  _Manager_type local_4d0;
  _Invoker_type local_4c8;
  undefined8 local_4c0;
  shared_ptr<nuraft::buffer> local_4b8;
  _Any_data local_4a8;
  code *local_498;
  code *pcStack_490;
  _Any_data local_488;
  code *local_478;
  code *pcStack_470;
  _Any_data local_468;
  code *local_458;
  code *pcStack_450;
  _Any_data local_448;
  code *local_438;
  code *pcStack_430;
  undefined1 *local_420;
  long local_418;
  undefined1 local_410 [16];
  undefined1 *local_400;
  long local_3f8;
  undefined1 local_3f0 [16];
  undefined1 *local_3e0;
  long local_3d8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [24];
  thread local_3a8;
  undefined1 local_3a0 [24];
  thread local_388;
  undefined1 local_378 [16];
  undefined1 local_368 [232];
  undefined1 local_280 [24];
  string local_268 [16];
  __pthread_internal_list local_258;
  undefined1 local_248 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  __native_type local_208 [3];
  undefined2 local_178;
  undefined1 local_176;
  __buckets_ptr local_170;
  size_type sStack_168;
  __node_base local_160;
  __node_base_ptr p_Stack_158;
  undefined1 local_150 [8];
  _Alloc_hider local_148;
  char local_138 [16];
  undefined1 local_128 [208];
  __native_type local_58;
  
  uVar19 = CONCAT71(in_register_00000039,with_meta) & 0xffffffff;
  raft_functional_common::reset_log_files();
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"localhost:20010","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"localhost:20020","");
  local_420 = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"localhost:20030","");
  local_3a0._16_4_ = 1;
  local_388._M_id._M_thread = (id)local_378;
  std::__cxx11::string::_M_construct<char*>((string *)&local_388,local_3e0,local_3e0 + local_3d8);
  memset(local_368,0,0xd0);
  local_368._208_2_ = 1;
  local_368[0xd2] = '\0';
  local_368._216_8_ = 0;
  local_368._224_8_ = 0;
  local_280._0_8_ = 0;
  local_280._8_8_ = 0;
  local_150._0_4_ = 2.8026e-45;
  local_148._M_p = local_138;
  std::__cxx11::string::_M_construct<char*>((string *)&local_148,local_400,local_400 + local_3f8);
  memset(local_128,0,0xd0);
  local_58.__size[0] = true;
  local_58.__size[1] = false;
  local_58.__size[2] = false;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._16_8_ = 0;
  local_58._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._32_8_ = 0;
  local_280._16_4_ = 3;
  local_268._0_8_ = &local_258;
  std::__cxx11::string::_M_construct<char*>(local_268,local_420,local_420 + local_418);
  memset(local_248,0,0xd0);
  local_178 = 1;
  local_176 = 0;
  local_170 = (__buckets_ptr)0x0;
  sStack_168 = 0;
  local_160._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_158 = (__node_base_ptr)0x0;
  local_5a8._0_8_ = local_3a0 + 0x10;
  local_5a8._8_8_ = local_150;
  aStack_598._M_allocated_capacity = (size_type)(local_280 + 0x10);
  __l._M_len = 3;
  __l._M_array = (iterator)local_5a8;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            (&local_4f0,__l,(allocator_type *)&local_5d0);
  TestSuite::_msg("launching asio-raft servers %s\n");
  ppRVar9 = local_4f0.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_4c0 = 0;
  local_4c8 = (_Invoker_type)0x0;
  local_4d0 = (_Manager_type)0x0;
  local_4d8 = 0;
  local_514 = (uint)CONCAT71(in_register_00000039,with_meta);
  if (local_4f0.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_4f0.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppRVar14 = local_4f0.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      if ((char)uVar19 != '\0') {
        this = *ppRVar14;
        local_498 = (code *)0x0;
        pcStack_490 = (code *)0x0;
        local_4a8._M_unused._M_object = (void *)0x0;
        local_4a8._8_8_ = 0;
        local_4a8._M_unused._M_object = operator_new(0x10);
        *(code **)local_4a8._M_unused._0_8_ = test_read_req_meta;
        *(undefined8 **)((long)local_4a8._M_unused._0_8_ + 8) = &local_4c0;
        pcStack_490 = std::
                      _Function_handler<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<bool_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                      ::_M_invoke;
        local_498 = std::
                    _Function_handler<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<bool_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    ::_M_manager;
        local_448._M_unused._M_object = (void *)0x0;
        local_448._8_8_ = 0;
        local_438 = (code *)0x0;
        pcStack_430 = (code *)0x0;
        local_448._M_unused._M_object = operator_new(0x10);
        *(code **)local_448._M_unused._0_8_ = test_write_req_meta_abi_cxx11_;
        *(_Invoker_type **)((long)local_448._M_unused._0_8_ + 8) = &local_4c8;
        pcStack_430 = std::
                      _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&),_std::_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>_>
                      ::_M_invoke;
        local_438 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&),_std::_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>_>
                    ::_M_manager;
        local_468._M_unused._M_object = (void *)0x0;
        local_468._8_8_ = 0;
        local_458 = (code *)0x0;
        pcStack_450 = (code *)0x0;
        local_468._M_unused._M_object = operator_new(0x10);
        *(code **)local_468._M_unused._0_8_ = test_read_resp_meta;
        *(_Manager_type **)((long)local_468._M_unused._0_8_ + 8) = &local_4d0;
        pcStack_450 = std::
                      _Function_handler<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<bool_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                      ::_M_invoke;
        local_458 = std::
                    _Function_handler<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<bool_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    ::_M_manager;
        local_488._M_unused._M_object = (void *)0x0;
        local_488._8_8_ = 0;
        local_478 = (code *)0x0;
        pcStack_470 = (code *)0x0;
        local_488._M_unused._M_object = operator_new(0x10);
        *(code **)local_488._M_unused._0_8_ = test_write_resp_meta_abi_cxx11_;
        *(undefined8 **)((long)local_488._M_unused._0_8_ + 8) = &local_4d8;
        pcStack_470 = std::
                      _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&),_std::_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>_>
                      ::_M_invoke;
        local_478 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&),_std::_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>_>
                    ::_M_manager;
        RaftAsioPkg::setMetaCallback
                  (this,(READ_META_FUNC *)&local_4a8,(WRITE_META_FUNC *)&local_448,
                   (READ_META_FUNC *)&local_468,(WRITE_META_FUNC *)&local_488,true);
        uVar19 = (ulong)local_514;
        if (local_478 != (code *)0x0) {
          (*local_478)(&local_488,&local_488,__destroy_functor);
        }
        if (local_458 != (code *)0x0) {
          (*local_458)(&local_468,&local_468,__destroy_functor);
        }
        if (local_438 != (code *)0x0) {
          (*local_438)(&local_448,&local_448,__destroy_functor);
        }
        if (local_498 != (code *)0x0) {
          (*local_498)(&local_4a8,&local_4a8,3);
        }
      }
      ppRVar14 = ppRVar14 + 1;
    } while (ppRVar14 != ppRVar9);
  }
  local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffffff00;
  local_5a8._8_8_ = (void *)0x0;
  aStack_598._M_allocated_capacity = 0;
  aStack_598._8_8_ = (_Manager_type)0x0;
  p_Stack_588 = (_Invoker_type)0x0;
  local_580._0_1_ = true;
  local_580._1_1_ = false;
  iVar6 = launch_servers(&local_4f0,false,false,true,(init_options *)local_5a8);
  if ((_Manager_type)aStack_598._8_8_ != (_Manager_type)0x0) {
    (*(code *)aStack_598._8_8_)(local_5a8 + 8,local_5a8 + 8,3);
  }
  if (iVar6 == 0) {
    TestSuite::_msg("enable batch size hint with positive value\n");
    for (ppRVar9 = local_4f0.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppRVar9 !=
        local_4f0.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppRVar9 = ppRVar9 + 1) {
      LOCK();
      ((*ppRVar9)->sm).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      [0x1c]._vptr_state_machine = (_func_int **)0x1;
      UNLOCK();
    }
    TestSuite::_msg("organizing raft group\n");
    iVar6 = make_group(&local_4f0);
    if (iVar6 == 0) {
      if ((*(int *)((long)&(((_Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                              *)&((__pthread_internal_list *)(local_368._64_8_ + 0x30))->__prev)->
                           _M_impl).super__Vector_impl_data._M_start + 4) ==
           *(int *)&((__pthread_internal_list *)(local_368._64_8_ + 0x30))->__next) &&
         (*(int *)&((__pthread_internal_list *)(local_368._64_8_ + 0x2c0))->__next == 3)) {
        if ((*(int *)((long)&(((_Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                *)&((__pthread_internal_list *)(local_368._64_8_ + 0x30))->__prev)->
                             _M_impl).super__Vector_impl_data._M_start + 4) !=
             *(int *)&((__pthread_internal_list *)(local_368._64_8_ + 0x30))->__next) ||
           (iVar6 = -1,
           *(int *)&((__pthread_internal_list *)(local_368._64_8_ + 0x2c0))->__next == 3)) {
          iVar6 = *(int *)((long)&(((_Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                     *)&((__pthread_internal_list *)(local_368._64_8_ + 0x30))->
                                        __prev)->_M_impl).super__Vector_impl_data._M_start + 4);
        }
        if (iVar6 == 1) {
          if ((*(int *)((__atomic_base<bool> *)
                        &((__pthread_internal_list *)(local_128._64_8_ + 0x30))->__prev + 4) !=
               *(int *)&((__pthread_internal_list *)(local_128._64_8_ + 0x30))->__next) ||
             (iVar6 = -1,
             *(int *)&((__pthread_internal_list *)(local_128._64_8_ + 0x2c0))->__next == 3)) {
            iVar6 = *(int *)((__atomic_base<bool> *)
                             &((__pthread_internal_list *)(local_128._64_8_ + 0x30))->__prev + 4);
          }
          if (iVar6 == 1) {
            if (((((atomic<int> *)(local_208[0].__align + 0x34))->super___atomic_base<int>)._M_i !=
                 *(int32 *)(local_208[0].__align + 0x38)) ||
               (iVar6 = -1,
               ((atomic<nuraft::srv_role> *)(local_208[0].__align + 0x2c8))->_M_i == leader)) {
              iVar6 = (((atomic<int> *)(local_208[0].__align + 0x34))->super___atomic_base<int>).
                      _M_i;
            }
            if (iVar6 == 1) {
              local_5a8._0_8_ = &aStack_598;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5a8,"wait for Raft group ready","");
              TestSuite::sleep_sec(1,(string *)local_5a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._0_8_ != &aStack_598) {
                operator_delete((void *)local_5a8._0_8_);
              }
              uVar19 = 0;
              do {
                cVar15 = '\x01';
                if (9 < uVar19) {
                  uVar10 = uVar19;
                  cVar3 = '\x04';
                  do {
                    cVar15 = cVar3;
                    if (uVar10 < 100) {
                      cVar15 = cVar15 + -2;
                      goto LAB_0018fc2e;
                    }
                    if (uVar10 < 1000) {
                      cVar15 = cVar15 + -1;
                      goto LAB_0018fc2e;
                    }
                    if (uVar10 < 10000) goto LAB_0018fc2e;
                    bVar5 = 99999 < uVar10;
                    uVar10 = uVar10 / 10000;
                    cVar3 = cVar15 + '\x04';
                  } while (bVar5);
                  cVar15 = cVar15 + '\x01';
                }
LAB_0018fc2e:
                local_5a8._0_8_ = &aStack_598;
                std::__cxx11::string::_M_construct((ulong)local_5a8,cVar15);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_5a8._0_8_,local_5a8._8_4_,uVar19);
                nuraft::buffer::alloc((buffer *)&local_530,local_5a8._8_8_ + 4);
                nuraft::buffer_serializer::buffer_serializer
                          ((buffer_serializer *)&local_5d0,(ptr<buffer> *)&local_530,LITTLE);
                nuraft::buffer_serializer::put_str
                          ((buffer_serializer *)&local_5d0,(string *)local_5a8);
                uVar2 = local_368._64_8_;
                local_540.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     local_530.
                     super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_540.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_530.
                         super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_530.
                    super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(_Atomic_word *)
                     ((long)local_530.
                            super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 8) =
                         *(_Atomic_word *)
                          ((long)local_530.
                                 super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                    UNLOCK();
                  }
                  else {
                    *(_Atomic_word *)
                     ((long)local_530.
                            super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 8) =
                         *(_Atomic_word *)
                          ((long)local_530.
                                 super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                  }
                }
                __l_00._M_len = 1;
                __l_00._M_array = &local_540;
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          *)local_510,__l_00,(allocator_type *)&local_4b8);
                nuraft::raft_server::append_entries
                          ((raft_server *)local_3a0,
                           (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                            *)uVar2);
                if ((element_type *)local_3a0._8_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a0._8_8_);
                }
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                           *)local_510);
                if (local_540.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_540.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_530.
                    super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_530.
                             super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5a8._0_8_ != &aStack_598) {
                  operator_delete((void *)local_5a8._0_8_);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != 100);
              local_5a8._0_8_ = &aStack_598;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5a8,"wait for replication","");
              TestSuite::sleep_sec(1,(string *)local_5a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._0_8_ != &aStack_598) {
                operator_delete((void *)local_5a8._0_8_);
              }
              bVar5 = raft_functional_common::TestSm::isSame
                                ((TestSm *)local_128._16_8_,(TestSm *)local_368._16_8_,false);
              if (bVar5) {
                bVar5 = raft_functional_common::TestSm::isSame
                                  ((TestSm *)local_238._M_pi,(TestSm *)local_368._16_8_,false);
                if (bVar5) {
                  TestSuite::_msg("disable batch size hint\n");
                  for (ppRVar9 = local_4f0.
                                 super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                      ppRVar9 !=
                      local_4f0.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish; ppRVar9 = ppRVar9 + 1) {
                    LOCK();
                    ((*ppRVar9)->sm).
                    super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [0x1c]._vptr_state_machine = (_func_int **)0x0;
                    UNLOCK();
                  }
                  uVar19 = 0;
                  do {
                    cVar15 = '\x01';
                    local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
                    if (9 < uVar19) {
                      uVar10 = uVar19;
                      cVar3 = '\x04';
                      do {
                        cVar15 = cVar3;
                        if (uVar10 < 100) {
                          cVar15 = cVar15 + -2;
                          goto LAB_001911d6;
                        }
                        if (uVar10 < 1000) {
                          cVar15 = cVar15 + -1;
                          goto LAB_001911d6;
                        }
                        if (uVar10 < 10000) goto LAB_001911d6;
                        bVar5 = 99999 < uVar10;
                        uVar10 = uVar10 / 10000;
                        cVar3 = cVar15 + '\x04';
                      } while (bVar5);
                      cVar15 = cVar15 + '\x01';
                    }
LAB_001911d6:
                    std::__cxx11::string::_M_construct((ulong)&local_5d0,cVar15);
                    std::__detail::__to_chars_10_impl<unsigned_long>
                              (local_5d0._M_dataplus._M_p,(uint)local_5d0._M_string_length,uVar19);
                    plVar8 = (long *)std::__cxx11::string::replace
                                               ((ulong)&local_5d0,0,(char *)0x0,0x4bdcfa);
                    local_5a8._0_8_ = &aStack_598;
                    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(plVar8 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar8 == paVar11) {
                      aStack_598._M_allocated_capacity = paVar11->_M_allocated_capacity;
                      aStack_598._8_8_ = plVar8[3];
                    }
                    else {
                      aStack_598._M_allocated_capacity = paVar11->_M_allocated_capacity;
                      local_5a8._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*plVar8;
                    }
                    local_5a8._8_8_ = plVar8[1];
                    *plVar8 = (long)paVar11;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                      operator_delete(local_5d0._M_dataplus._M_p);
                    }
                    nuraft::buffer::alloc((buffer *)&local_530,local_5a8._8_8_ + 4);
                    nuraft::buffer_serializer::buffer_serializer
                              ((buffer_serializer *)&local_5d0,(ptr<buffer> *)&local_530,LITTLE);
                    nuraft::buffer_serializer::put_str
                              ((buffer_serializer *)&local_5d0,(string *)local_5a8);
                    uVar2 = local_368._64_8_;
                    local_540.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         = (element_type *)
                           local_530.
                           super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                    local_540.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_530.
                         super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_530.
                        super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        *(_Atomic_word *)
                         ((long)local_530.
                                super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 8) =
                             *(_Atomic_word *)
                              ((long)local_530.
                                     super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                        UNLOCK();
                      }
                      else {
                        *(_Atomic_word *)
                         ((long)local_530.
                                super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 8) =
                             *(_Atomic_word *)
                              ((long)local_530.
                                     super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                      }
                    }
                    __l_01._M_len = 1;
                    __l_01._M_array = &local_540;
                    std::
                    vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                              *)local_510,__l_01,(allocator_type *)&local_4b8);
                    nuraft::raft_server::append_entries
                              ((raft_server *)(local_3c0 + 0x10),
                               (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                *)uVar2);
                    if (local_3a8._M_id._M_thread != 0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_3a8._M_id._M_thread);
                    }
                    std::
                    vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                               *)local_510);
                    if (local_540.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_540.
                                 super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_530.
                        super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_530.
                                 super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5a8._0_8_ != &aStack_598) {
                      operator_delete((void *)local_5a8._0_8_);
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar19 != 100);
                  local_5a8._0_8_ = &aStack_598;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_5a8,"wait for replication","");
                  TestSuite::sleep_sec(1,(string *)local_5a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5a8._0_8_ != &aStack_598) {
                    operator_delete((void *)local_5a8._0_8_);
                  }
                  bVar5 = raft_functional_common::TestSm::isSame
                                    ((TestSm *)local_128._16_8_,(TestSm *)local_368._16_8_,false);
                  if (bVar5) {
                    bVar5 = raft_functional_common::TestSm::isSame
                                      ((TestSm *)local_238._M_pi,(TestSm *)local_368._16_8_,false);
                    if (bVar5) {
                      TestSuite::_msg("enable batch size hint with negative value\n");
                      for (ppRVar9 = local_4f0.
                                     super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                          ppRVar9 !=
                          local_4f0.
                          super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                          super__Vector_impl_data._M_finish; ppRVar9 = ppRVar9 + 1) {
                        LOCK();
                        ((*ppRVar9)->sm).
                        super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        [0x1c]._vptr_state_machine = (_func_int **)0xffffffffffffffff;
                        UNLOCK();
                      }
                      local_5a8._0_8_ = &aStack_598;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_5a8,
                                 "wait peer\'s hint size info refreshed in leader side","");
                      TestSuite::sleep_sec(1,(string *)local_5a8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_5a8._0_8_ != &aStack_598) {
                        operator_delete((void *)local_5a8._0_8_);
                      }
                      nuraft::raft_server::get_current_params
                                ((raft_params *)local_5a8,(raft_server *)local_368._64_8_);
                      local_57c = 1000;
                      nuraft::raft_server::update_params
                                ((raft_server *)local_368._64_8_,(raft_params *)local_5a8);
                      __val = 0;
                      do {
                        local_510._0_8_ = (pointer)(local_510 + 0x10);
                        std::__cxx11::string::_M_construct((ulong)local_510,'\x01');
                        std::__detail::__to_chars_10_impl<unsigned_long>
                                  ((char *)local_510._0_8_,local_510._8_4_,__val);
                        plVar8 = (long *)std::__cxx11::string::replace
                                                   ((ulong)local_510,0,(char *)0x0,0x4bdd5f);
                        local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
                        psVar12 = (size_type *)(plVar8 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar8 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar12) {
                          local_5d0.field_2._M_allocated_capacity = *psVar12;
                          local_5d0.field_2._8_8_ = plVar8[3];
                        }
                        else {
                          local_5d0.field_2._M_allocated_capacity = *psVar12;
                          local_5d0._M_dataplus._M_p = (pointer)*plVar8;
                        }
                        local_5d0._M_string_length = plVar8[1];
                        *plVar8 = (long)psVar12;
                        plVar8[1] = 0;
                        *(undefined1 *)(plVar8 + 2) = 0;
                        if ((pointer)local_510._0_8_ != (pointer)(local_510 + 0x10)) {
                          operator_delete((void *)local_510._0_8_);
                        }
                        nuraft::buffer::alloc((buffer *)&local_540,local_5d0._M_string_length + 4);
                        nuraft::buffer_serializer::buffer_serializer
                                  ((buffer_serializer *)local_510,(ptr<buffer> *)&local_540,LITTLE);
                        nuraft::buffer_serializer::put_str
                                  ((buffer_serializer *)local_510,&local_5d0);
                        uVar2 = local_368._64_8_;
                        local_4b8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr = local_540.
                                 super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                        local_4b8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi =
                             local_540.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                        if (local_540.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            (local_540.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count =
                                 (local_540.
                                  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            (local_540.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count =
                                 (local_540.
                                  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                          }
                        }
                        __l_02._M_len = 1;
                        __l_02._M_array = &local_4b8;
                        std::
                        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        ::vector(&local_530,__l_02,&local_5a9);
                        nuraft::raft_server::append_entries
                                  ((raft_server *)local_3c0,
                                   (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                    *)uVar2);
                        if ((element_type *)local_3c0._8_8_ != (element_type *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_
                                    );
                        }
                        std::
                        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        ::~vector(&local_530);
                        if (local_4b8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_4b8.
                                     super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi);
                        }
                        if (local_540.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_540.
                                     super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                          operator_delete(local_5d0._M_dataplus._M_p);
                        }
                        __val = __val + 1;
                      } while (__val != 3);
                      local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_5d0,
                                 "wait for replication but actually no replication happen","");
                      TestSuite::sleep_sec(1,&local_5d0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                        operator_delete(local_5d0._M_dataplus._M_p);
                      }
                      bVar5 = raft_functional_common::TestSm::isSame
                                        ((TestSm *)local_128._16_8_,(TestSm *)local_368._16_8_,false
                                        );
                      if (bVar5) {
                        bVar5 = raft_functional_common::TestSm::isSame
                                          ((TestSm *)local_238._M_pi,(TestSm *)local_368._16_8_,
                                           false);
                        iVar6 = (int)local_368._16_8_;
                        if (bVar5) {
                          iVar13 = extraout_EDX;
                          if ((char)local_514 != '\0') {
                            iVar6 = (int)local_4c0;
                            if (iVar6 < 1) {
                              poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"        time: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;30m",7);
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar7,local_5d0._M_dataplus._M_p,
                                                  local_5d0._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"      thread: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[33m",5);
                              lVar1 = *(long *)poVar7;
                              *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5
                                   | 8;
                              *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                              poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                              if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                                oVar4 = (ostream)std::ios::widen((char)poVar18);
                                poVar18[0xe0] = oVar4;
                                poVar18[0xe1] = (ostream)0x1;
                              }
                              poVar18[0xe0] = (ostream)0x30;
                              local_510._0_8_ = pthread_self();
                              std::hash<std::thread::id>::operator()
                                        ((hash<std::thread::id> *)&local_530,(id *)local_510);
                              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                              *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                                   0xffffffb5 | 2;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          in: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[36m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"response_hint_test",0x12);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"()\x1b[0m",6);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          at: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[32m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                         ,0x6b);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m:",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;35m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2db);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    expected: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;34mread_req_cb_count.load() > 0\x1b[0m\n",
                                         0x28);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    value of ",0xd);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;32mread_req_cb_count.load()\x1b[0m: ",0x25);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;31m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    value of ",0xd);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;32m0\x1b[0m: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;31m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                                operator_delete(local_5d0._M_dataplus._M_p);
                              }
                              iVar6 = -1;
                              TestSuite::failHandler();
                              goto LAB_0019013f;
                            }
                            iVar6 = (int)local_4c8;
                            if (iVar6 < 1) {
                              poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"        time: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;30m",7);
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar7,local_5d0._M_dataplus._M_p,
                                                  local_5d0._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"      thread: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[33m",5);
                              lVar1 = *(long *)poVar7;
                              *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5
                                   | 8;
                              *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                              poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                              if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                                oVar4 = (ostream)std::ios::widen((char)poVar18);
                                poVar18[0xe0] = oVar4;
                                poVar18[0xe1] = (ostream)0x1;
                              }
                              poVar18[0xe0] = (ostream)0x30;
                              local_510._0_8_ = pthread_self();
                              std::hash<std::thread::id>::operator()
                                        ((hash<std::thread::id> *)&local_530,(id *)local_510);
                              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                              *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                                   0xffffffb5 | 2;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          in: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[36m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"response_hint_test",0x12);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"()\x1b[0m",6);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          at: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[32m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                         ,0x6b);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m:",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;35m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2dc);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    expected: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;34mwrite_req_cb_count.load() > 0\x1b[0m\n",
                                         0x29);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    value of ",0xd);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;32mwrite_req_cb_count.load()\x1b[0m: ",0x26)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;31m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    value of ",0xd);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;32m0\x1b[0m: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;31m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                                operator_delete(local_5d0._M_dataplus._M_p);
                              }
                              iVar6 = -1;
                              TestSuite::failHandler();
                              goto LAB_0019013f;
                            }
                            iVar6 = (int)local_4d0;
                            if (iVar6 < 1) {
                              poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"        time: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;30m",7);
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar7,local_5d0._M_dataplus._M_p,
                                                  local_5d0._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"      thread: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[33m",5);
                              lVar1 = *(long *)poVar7;
                              *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5
                                   | 8;
                              *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                              poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                              if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                                oVar4 = (ostream)std::ios::widen((char)poVar18);
                                poVar18[0xe0] = oVar4;
                                poVar18[0xe1] = (ostream)0x1;
                              }
                              poVar18[0xe0] = (ostream)0x30;
                              local_510._0_8_ = pthread_self();
                              std::hash<std::thread::id>::operator()
                                        ((hash<std::thread::id> *)&local_530,(id *)local_510);
                              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                              *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                                   0xffffffb5 | 2;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          in: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[36m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"response_hint_test",0x12);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"()\x1b[0m",6);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          at: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[32m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                         ,0x6b);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m:",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;35m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2dd);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    expected: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;34mread_resp_cb_count.load() > 0\x1b[0m\n",
                                         0x29);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    value of ",0xd);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;32mread_resp_cb_count.load()\x1b[0m: ",0x26)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;31m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    value of ",0xd);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;32m0\x1b[0m: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;31m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                                operator_delete(local_5d0._M_dataplus._M_p);
                              }
                              iVar6 = -1;
                              TestSuite::failHandler();
                              goto LAB_0019013f;
                            }
                            iVar6 = (int)local_4d8;
                            if (iVar6 < 1) {
                              poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"        time: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;30m",7);
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar7,local_5d0._M_dataplus._M_p,
                                                  local_5d0._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"      thread: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[33m",5);
                              lVar1 = *(long *)poVar7;
                              *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5
                                   | 8;
                              *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                              poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                              if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                                oVar4 = (ostream)std::ios::widen((char)poVar18);
                                poVar18[0xe0] = oVar4;
                                poVar18[0xe1] = (ostream)0x1;
                              }
                              poVar18[0xe0] = (ostream)0x30;
                              local_510._0_8_ = pthread_self();
                              std::hash<std::thread::id>::operator()
                                        ((hash<std::thread::id> *)&local_530,(id *)local_510);
                              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                              *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                                   0xffffffb5 | 2;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          in: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[36m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"response_hint_test",0x12);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"()\x1b[0m",6);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          at: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[32m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                         ,0x6b);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m:",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;35m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2de);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    expected: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;34mwrite_resp_cb_count.load() > 0\x1b[0m\n",
                                         0x2a);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    value of ",0xd);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;32mwrite_resp_cb_count.load()\x1b[0m: ",0x27
                                        );
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;31m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    value of ",0xd);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;32m0\x1b[0m: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;31m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                                operator_delete(local_5d0._M_dataplus._M_p);
                              }
                              iVar6 = -1;
                              TestSuite::failHandler();
                              goto LAB_0019013f;
                            }
                            TestSuite::_msg("read req callback %zu, write req callback %zu\n",
                                            local_4c0,local_4c8);
                            p_Var16 = local_4d0;
                            TestSuite::_msg("read resp callback %zu, write resp callback %zu\n",
                                            local_4d0,local_4d8);
                            iVar6 = (int)p_Var16;
                            iVar13 = extraout_EDX_00;
                          }
                          nuraft::raft_server::shutdown
                                    ((raft_server *)local_368._64_8_,iVar6,iVar13);
                          nuraft::raft_server::shutdown((raft_server *)local_128._64_8_,iVar6,__how)
                          ;
                          nuraft::raft_server::shutdown
                                    ((raft_server *)local_208[0]._0_8_,iVar6,__how_00);
                          local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_5d0,"shutting down","");
                          msg_00 = &local_5d0;
                          TestSuite::sleep_sec(1,msg_00);
                          iVar13 = (int)msg_00;
                          _Var17._M_p = local_5d0._M_dataplus._M_p;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                            operator_delete(local_5d0._M_dataplus._M_p);
                          }
                          iVar6 = 0;
                          SimpleLogger::shutdown((int)_Var17._M_p,iVar13);
                          goto LAB_0019013f;
                        }
                        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"        time: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                        TestSuite::getTimeString_abi_cxx11_();
                        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar7,local_5d0._M_dataplus._M_p,
                                            local_5d0._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"      thread: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                        lVar1 = *(long *)poVar7;
                        *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                             *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
                        *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                        poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                        if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                          oVar4 = (ostream)std::ios::widen((char)poVar18);
                          poVar18[0xe0] = oVar4;
                          poVar18[0xe1] = (ostream)0x1;
                        }
                        poVar18[0xe0] = (ostream)0x30;
                        local_510._0_8_ = pthread_self();
                        std::hash<std::thread::id>::operator()
                                  ((hash<std::thread::id> *)&local_530,(id *)local_510);
                        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                             0xffffffb5 | 2;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"          in: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"response_hint_test",0x12);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"          at: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                   ,0x6b);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2d7);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,
                                   "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                   ,0x43);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"    expected: \x1b[1;32m",0x15);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"      actual: \x1b[1;31m",0x15);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                      }
                      else {
                        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"        time: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                        TestSuite::getTimeString_abi_cxx11_();
                        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar7,local_5d0._M_dataplus._M_p,
                                            local_5d0._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"      thread: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                        lVar1 = *(long *)poVar7;
                        *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                             *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
                        *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                        poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                        if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                          oVar4 = (ostream)std::ios::widen((char)poVar18);
                          poVar18[0xe0] = oVar4;
                          poVar18[0xe1] = (ostream)0x1;
                        }
                        poVar18[0xe0] = (ostream)0x30;
                        local_510._0_8_ = pthread_self();
                        std::hash<std::thread::id>::operator()
                                  ((hash<std::thread::id> *)&local_530,(id *)local_510);
                        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                             0xffffffb5 | 2;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"          in: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"response_hint_test",0x12);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"          at: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                   ,0x6b);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2d6);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,
                                   "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                   ,0x43);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"    expected: \x1b[1;32m",0x15);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"      actual: \x1b[1;31m",0x15);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                        operator_delete(local_5d0._M_dataplus._M_p);
                      }
                      iVar6 = -1;
                      TestSuite::failHandler();
                      goto LAB_0019013f;
                    }
                    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                    lVar1 = *(long *)poVar7;
                    *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                         *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
                    *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                    poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                    if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                      oVar4 = (ostream)std::ios::widen((char)poVar18);
                      poVar18[0xe0] = oVar4;
                      poVar18[0xe1] = (ostream)0x1;
                    }
                    poVar18[0xe0] = (ostream)0x30;
                    local_5d0._M_dataplus._M_p = (pointer)pthread_self();
                    std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)local_510,(id *)&local_5d0);
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5
                         | 2;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,"response_hint_test",0x12);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                               ,0x6b);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2bd);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,
                               "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                               ,0x43);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,"    expected: \x1b[1;32m",0x15);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,"      actual: \x1b[1;31m",0x15);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                  }
                  else {
                    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                    lVar1 = *(long *)poVar7;
                    *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                         *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
                    *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                    poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                    if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                      oVar4 = (ostream)std::ios::widen((char)poVar18);
                      poVar18[0xe0] = oVar4;
                      poVar18[0xe1] = (ostream)0x1;
                    }
                    poVar18[0xe0] = (ostream)0x30;
                    local_5d0._M_dataplus._M_p = (pointer)pthread_self();
                    std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)local_510,(id *)&local_5d0);
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5
                         | 2;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,"response_hint_test",0x12);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                               ,0x6b);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                    poVar7 = (ostream *)std::ostream::operator<<(poVar7,700);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,
                               "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                               ,0x43);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,"    expected: \x1b[1;32m",0x15);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,"      actual: \x1b[1;31m",0x15);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                  }
                }
                else {
                  poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                  TestSuite::getTimeString_abi_cxx11_();
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                  lVar1 = *(long *)poVar7;
                  *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                       *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
                  *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                  poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                  if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                    oVar4 = (ostream)std::ios::widen((char)poVar18);
                    poVar18[0xe0] = oVar4;
                    poVar18[0xe1] = (ostream)0x1;
                  }
                  poVar18[0xe0] = (ostream)0x30;
                  local_5d0._M_dataplus._M_p = (pointer)pthread_self();
                  std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)local_510,(id *)&local_5d0);
                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                  *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                       *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 |
                       2;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"response_hint_test",0x12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                             ,0x6b);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2ab);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,
                             "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                             ,0x43);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"    expected: \x1b[1;32m",0x15);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"      actual: \x1b[1;31m",0x15);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                }
              }
              else {
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                std::ostream::put(-0x38);
                poVar7 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                TestSuite::getTimeString_abi_cxx11_();
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                lVar1 = *(long *)poVar7;
                *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                     *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
                *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
                if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                  oVar4 = (ostream)std::ios::widen((char)poVar18);
                  poVar18[0xe0] = oVar4;
                  poVar18[0xe1] = (ostream)0x1;
                }
                poVar18[0xe0] = (ostream)0x30;
                local_5d0._M_dataplus._M_p = (pointer)pthread_self();
                std::_Hash_bytes(&local_5d0,8,0xc70f6907);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                     *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"response_hint_test",0x12)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                           ,0x6b);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2aa);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,
                           "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                           ,0x43);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"    expected: \x1b[1;32m",0x15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"      actual: \x1b[1;31m",0x15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._0_8_ != &aStack_598) {
                operator_delete((void *)local_5a8._0_8_);
              }
              iVar6 = -1;
              TestSuite::failHandler();
            }
            else {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
              std::ostream::put(-0x38);
              poVar7 = (ostream *)std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
              TestSuite::getTimeString_abi_cxx11_();
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
              lVar1 = *(long *)poVar7;
              *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                   *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
              *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
              poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
              if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
                oVar4 = (ostream)std::ios::widen((char)poVar18);
                poVar18[0xe0] = oVar4;
                poVar18[0xe1] = (ostream)0x1;
              }
              poVar18[0xe0] = (ostream)0x30;
              local_5d0._M_dataplus._M_p = (pointer)pthread_self();
              std::_Hash_bytes(&local_5d0,8,0xc70f6907);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                   *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"response_hint_test",0x12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                         ,0x6b);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x29c);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"    value of: \x1b[1;34ms3.raftServer->get_leader()\x1b[0m\n",0x35)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"    expected: \x1b[1;32m",0x15);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"      actual: \x1b[1;31m",0x15);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._0_8_ != &aStack_598) {
                operator_delete((void *)local_5a8._0_8_);
              }
              iVar6 = -1;
              TestSuite::failHandler();
            }
          }
          else {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
            std::ostream::put(-0x38);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
            TestSuite::getTimeString_abi_cxx11_();
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
            lVar1 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
            *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
            poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
            if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
              oVar4 = (ostream)std::ios::widen((char)poVar18);
              poVar18[0xe0] = oVar4;
              poVar18[0xe1] = (ostream)0x1;
            }
            poVar18[0xe0] = (ostream)0x30;
            local_5d0._M_dataplus._M_p = (pointer)pthread_self();
            std::_Hash_bytes(&local_5d0,8,0xc70f6907);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"response_hint_test",0x12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                       ,0x6b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x29b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"    value of: \x1b[1;34ms2.raftServer->get_leader()\x1b[0m\n",0x35);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"    expected: \x1b[1;32m",0x15);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"      actual: \x1b[1;31m",0x15);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a8._0_8_ != &aStack_598) {
              operator_delete((void *)local_5a8._0_8_);
            }
            iVar6 = -1;
            TestSuite::failHandler();
          }
        }
        else {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
          lVar1 = *(long *)poVar7;
          *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
          poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
          if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
            oVar4 = (ostream)std::ios::widen((char)poVar18);
            poVar18[0xe0] = oVar4;
            poVar18[0xe1] = (ostream)0x1;
          }
          poVar18[0xe0] = (ostream)0x30;
          local_5d0._M_dataplus._M_p = (pointer)pthread_self();
          std::_Hash_bytes(&local_5d0,8,0xc70f6907);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"response_hint_test",0x12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x29a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"    value of: \x1b[1;34ms1.raftServer->get_leader()\x1b[0m\n",0x35);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._0_8_ != &aStack_598) {
            operator_delete((void *)local_5a8._0_8_);
          }
          iVar6 = -1;
          TestSuite::failHandler();
        }
      }
      else {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        poVar7 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
        lVar1 = *(long *)poVar7;
        *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
        poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
        if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
          oVar4 = (ostream)std::ios::widen((char)poVar18);
          poVar18[0xe0] = oVar4;
          poVar18[0xe1] = (ostream)0x1;
        }
        poVar18[0xe0] = (ostream)0x30;
        local_5d0._M_dataplus._M_p = (pointer)pthread_self();
        std::_Hash_bytes(&local_5d0,8,0xc70f6907);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"response_hint_test",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x299);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"    value of: \x1b[1;34ms1.raftServer->is_leader()\x1b[0m\n",0x34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._0_8_ != &aStack_598) {
          operator_delete((void *)local_5a8._0_8_);
        }
        iVar6 = -1;
        TestSuite::failHandler();
      }
    }
    else {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
      lVar1 = *(long *)poVar7;
      *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
           *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
      poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
      if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar4 = (ostream)std::ios::widen((char)poVar18);
        poVar18[0xe0] = oVar4;
        poVar18[0xe1] = (ostream)0x1;
      }
      poVar18[0xe0] = (ostream)0x30;
      local_5d0._M_dataplus._M_p = (pointer)pthread_self();
      std::_Hash_bytes(&local_5d0,8,0xc70f6907);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
           *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"response_hint_test",0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x297);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._0_8_ != &aStack_598) {
        operator_delete((void *)local_5a8._0_8_);
      }
      iVar6 = -1;
      TestSuite::failHandler();
    }
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_5a8._0_8_,local_5a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
    lVar1 = *(long *)poVar7;
    *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    poVar18 = poVar7 + *(long *)(lVar1 + -0x18);
    if (poVar7[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar18);
      poVar18[0xe0] = oVar4;
      poVar18[0xe1] = (ostream)0x1;
    }
    poVar18[0xe0] = (ostream)0x30;
    local_5d0._M_dataplus._M_p = (pointer)pthread_self();
    std::_Hash_bytes(&local_5d0,8,0xc70f6907);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"response_hint_test",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x28f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._0_8_ != &aStack_598) {
      operator_delete((void *)local_5a8._0_8_);
    }
    iVar6 = -1;
    TestSuite::failHandler();
  }
LAB_0019013f:
  if (local_4f0.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f0.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)(local_280 + 0x10));
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)local_150);
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)(local_3a0 + 0x10));
  if (local_420 != local_410) {
    operator_delete(local_420);
  }
  if (local_400 != local_3f0) {
    operator_delete(local_400);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  return iVar6;
}

Assistant:

int response_hint_test(bool with_meta) {
    reset_log_files();

    std::string s1_addr = "localhost:20010";
    std::string s2_addr = "localhost:20020";
    std::string s3_addr = "localhost:20030";

    RaftAsioPkg s1(1, s1_addr);
    RaftAsioPkg s2(2, s2_addr);
    RaftAsioPkg s3(3, s3_addr);
    std::vector<RaftAsioPkg*> pkgs = {&s1, &s2, &s3};

    _msg("launching asio-raft servers %s\n",
         with_meta ? "(with meta)" : "");
    std::atomic<size_t> read_req_cb_count(0);
    std::atomic<size_t> write_req_cb_count(0);
    std::atomic<size_t> read_resp_cb_count(0);
    std::atomic<size_t> write_resp_cb_count(0);
    for (RaftAsioPkg* ee: pkgs) {
        if (with_meta) {
            ee->setMetaCallback
                ( std::bind( test_read_req_meta,
                             &read_req_cb_count,
                             std::placeholders::_1,
                             std::placeholders::_2 ),
                  std::bind( test_write_req_meta,
                             &write_req_cb_count,
                             std::placeholders::_1 ),
                  std::bind( test_read_resp_meta,
                             &read_resp_cb_count,
                             std::placeholders::_1,
                             std::placeholders::_2 ),
                  std::bind( test_write_resp_meta,
                             &write_resp_cb_count,
                             std::placeholders::_1 ),
                  true );
        }
    }
    CHK_Z( launch_servers(pkgs, false) );

    _msg("enable batch size hint with positive value\n");
    for (RaftAsioPkg* ee: pkgs) {
        ee->getTestSm()->set_next_batch_size_hint_in_bytes(1);
    }

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );

    CHK_TRUE( s1.raftServer->is_leader() );
    CHK_EQ(1, s1.raftServer->get_leader());
    CHK_EQ(1, s2.raftServer->get_leader());
    CHK_EQ(1, s3.raftServer->get_leader());
    TestSuite::sleep_sec(1, "wait for Raft group ready");

    const size_t NUM = 100;
    for (size_t ii=0; ii<NUM; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication");

    // State machine should be identical.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    _msg("disable batch size hint\n");
    for (RaftAsioPkg* ee: pkgs) {
        ee->getTestSm()->set_next_batch_size_hint_in_bytes(0);
    }

    for (size_t ii=0; ii<NUM; ++ii) {
        std::string msg_str = "2nd_" + std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication");

    // State machine should be identical.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    _msg("enable batch size hint with negative value\n");
    for (RaftAsioPkg* ee: pkgs) {
        ee->getTestSm()->set_next_batch_size_hint_in_bytes(-1);
    }

    TestSuite::sleep_sec(1, "wait peer's hint size info refreshed in leader side");

    // With negative hint size, append_entries will timeout due to
    // raft server can not commit. Set timeout to a small value.
    raft_params params = s1.raftServer->get_current_params();
    params.with_client_req_timeout(1000);
    s1.raftServer->update_params(params);

    for (size_t ii=0; ii<3; ++ii) {
        std::string msg_str = "3rd_" + std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication but actually no replication happen");

    // State machine should be identical. All are not committed.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    if (with_meta) {
        // Callback functions for meta should have been called.
        CHK_GT(read_req_cb_count.load(), 0);
        CHK_GT(write_req_cb_count.load(), 0);
        CHK_GT(read_resp_cb_count.load(), 0);
        CHK_GT(write_resp_cb_count.load(), 0);
        _msg( "read req callback %zu, write req callback %zu\n",
              read_req_cb_count.load(), write_req_cb_count.load() );
        _msg( "read resp callback %zu, write resp callback %zu\n",
              read_resp_cb_count.load(), write_resp_cb_count.load() );
    }

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}